

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLRICKSHAWMAN_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000448;
  double *in_stack_00000450;
  double *in_stack_00000458;
  double *in_stack_00000460;
  int in_stack_0000046c;
  int in_stack_00000470;
  int *in_stack_00000480;
  int *in_stack_00000488;
  int *in_stack_00000490;
  
  TVar1 = TA_CDLRICKSHAWMAN(in_stack_00000470,in_stack_0000046c,in_stack_00000460,in_stack_00000458,
                            in_stack_00000450,in_stack_00000448,in_stack_00000480,in_stack_00000488,
                            in_stack_00000490);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLRICKSHAWMAN_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLRICKSHAWMAN(
/* Generated */                        startIdx,
/* Generated */                        endIdx,
/* Generated */                        params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                        params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                        params->in[0].data.inPrice.low, /* inLow */
/* Generated */                        params->in[0].data.inPrice.close, /* inClose */
/* Generated */                        outBegIdx, 
/* Generated */                        outNBElement, 
/* Generated */                        params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }